

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::StringOutputStream::Next(StringOutputStream *this,void **data,int *size)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  size_t sVar1;
  int iVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long *puVar6;
  char *pcVar7;
  unsigned_long local_70;
  unsigned_long local_68;
  unsigned_long local_60;
  size_t new_size;
  size_t old_size;
  byte local_39;
  LogMessage local_38;
  Voidify local_21;
  int *local_20;
  int *size_local;
  void **data_local;
  StringOutputStream *this_local;
  
  local_39 = 0;
  local_20 = size;
  size_local = (int *)data;
  data_local = (void **)this;
  if (this->target_ == (string *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x84,"target_ != nullptr");
    local_39 = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar3);
  }
  if ((local_39 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  uVar4 = std::__cxx11::string::size();
  new_size = uVar4;
  uVar5 = std::__cxx11::string::capacity();
  if (uVar4 < uVar5) {
    local_60 = std::__cxx11::string::capacity();
  }
  else {
    local_60 = new_size << 1;
  }
  sVar1 = new_size;
  iVar2 = std::numeric_limits<int>::max();
  local_68 = sVar1 + (long)iVar2;
  puVar6 = std::min<unsigned_long>(&local_60,&local_68);
  local_60 = *puVar6;
  s = this->target_;
  local_70 = 0x10;
  puVar6 = std::max<unsigned_long>(&local_60,&local_70);
  absl::lts_20250127::strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
            (s,*puVar6);
  pcVar7 = mutable_string_data(this->target_);
  *(char **)size_local = pcVar7 + new_size;
  iVar2 = std::__cxx11::string::size();
  *local_20 = iVar2 - (int)new_size;
  return true;
}

Assistant:

bool StringOutputStream::Next(void** data, int* size) {
  ABSL_CHECK(target_ != nullptr);
  size_t old_size = target_->size();

  // Grow the string.
  size_t new_size;
  if (old_size < target_->capacity()) {
    // Resize the string to match its capacity, since we can get away
    // without a memory allocation this way.
    new_size = target_->capacity();
  } else {
    // Size has reached capacity, try to double it.
    new_size = old_size * 2;
  }
  // Avoid integer overflow in returned '*size'.
  new_size = std::min(new_size, old_size + std::numeric_limits<int>::max());
  // Increase the size, also make sure that it is at least kMinimumSize.
  absl::strings_internal::STLStringResizeUninitialized(
      target_,
      std::max(new_size,
               kMinimumSize + 0));  // "+ 0" works around GCC4 weirdness.

  *data = mutable_string_data(target_) + old_size;
  *size = target_->size() - old_size;
  return true;
}